

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O0

void board::makemove::undo(Board *pos)

{
  uint64_t uVar1;
  uint move_00;
  int to_00;
  int iVar2;
  int piece;
  int iVar3;
  int iVar4;
  int promoted;
  int captured;
  int to;
  int from;
  int move;
  Undo undo;
  Board *pos_local;
  
  undo.hashKey = (uint64_t)pos;
  Board::decrementPly(pos);
  Board::popHistory((Undo *)&from,(Board *)undo.hashKey);
  move_00 = Undo::getMoveValue((Undo *)&from);
  to_00 = Move::FROMSQ(move_00);
  iVar2 = Move::TOSQ(move_00);
  piece = Move::CAPTURED(move_00);
  iVar3 = Move::PROMOTED(move_00);
  uVar1 = undo.hashKey;
  iVar4 = Undo::getFiftyMove((Undo *)&from);
  Board::setFiftyMove((Board *)uVar1,iVar4);
  iVar4 = Board::getEnPas((Board *)undo.hashKey);
  if (iVar4 != 99) {
    Board::hashEnPas((Board *)undo.hashKey);
  }
  uVar1 = undo.hashKey;
  iVar4 = Undo::getEnPas((Undo *)&from);
  Board::setEnPas((Board *)uVar1,iVar4);
  iVar4 = Board::getEnPas((Board *)undo.hashKey);
  if (iVar4 != 99) {
    Board::hashEnPas((Board *)undo.hashKey);
  }
  Board::hashCastle((Board *)undo.hashKey);
  uVar1 = undo.hashKey;
  iVar4 = Undo::getCastlePerm((Undo *)&from);
  Board::setCastlePerm((Board *)uVar1,iVar4);
  Board::hashCastle((Board *)undo.hashKey);
  Board::updateSide((Board *)undo.hashKey);
  Board::hashSide((Board *)undo.hashKey);
  if ((move_00 & 0x40000) == 0) {
    if ((move_00 & 0x1000000) != 0) {
      if (iVar2 == 0x17) {
        movePiece(0x18,0x15,(Board *)undo.hashKey);
      }
      else if (iVar2 == 0x5d) {
        movePiece(0x5e,0x5b,(Board *)undo.hashKey);
      }
      else if (iVar2 == 0x1b) {
        movePiece(0x1a,0x1c,(Board *)undo.hashKey);
      }
      else if (iVar2 == 0x61) {
        movePiece(0x60,0x62,(Board *)undo.hashKey);
      }
    }
  }
  else {
    iVar4 = Board::getSide((Board *)undo.hashKey);
    if (iVar4 == 0) {
      addPiece(7,iVar2 + -10,(Board *)undo.hashKey);
    }
    else {
      addPiece(1,iVar2 + 10,(Board *)undo.hashKey);
    }
  }
  movePiece(iVar2,to_00,(Board *)undo.hashKey);
  if (piece != 0) {
    addPiece(piece,iVar2,(Board *)undo.hashKey);
  }
  if (iVar3 != 0) {
    clearPiece(to_00,(Board *)undo.hashKey);
    iVar2 = 7;
    if (Board::PIECE_COLOR[iVar3] == 0) {
      iVar2 = 1;
    }
    addPiece(iVar2,to_00,(Board *)undo.hashKey);
  }
  return;
}

Assistant:

void board::makemove::undo(Board& pos)
{
    pos.decrementPly();
    Undo undo = pos.popHistory();
    int move = undo.getMoveValue();
    int from = Move::FROMSQ(move);
    int to = Move::TOSQ(move);
    int captured = Move::CAPTURED(move);
    int promoted = Move::PROMOTED(move);
    pos.setFiftyMove(undo.getFiftyMove());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.setEnPas(undo.getEnPas());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.setCastlePerm(undo.getCastlePerm());
    pos.hashCastle();
    pos.updateSide();
    pos.hashSide();
    if (Move::MFLAGEP & move) {
        if (pos.getSide() == WHITE) {
            addPiece(BP, to - 10, pos);
        }
        else {
            addPiece(WP, to + 10, pos);
        }
    }
    else if (Move::MFLAGCA & move) {
        if (to == C1) {
            movePiece(D1, A1, pos);
        }
        else if (to == C8) {
            movePiece(D8, A8, pos);
        }
        else if (to == G1) {
            movePiece(F1, H1, pos);
        }
        else if (to == G8) {
            movePiece(F8, H8, pos);
        }
    }
    movePiece(to, from, pos);
    if (captured != EMPTY) {
        addPiece(captured, to, pos);
    }
    if (promoted != EMPTY) {
        clearPiece(from, pos);
        addPiece(Board::PIECE_COLOR[promoted] == WHITE ? WP : BP, from, pos);
    }
}